

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR lyxp_vars_set(lyxp_var **vars,char *name,char *value)

{
  LY_ERR LVar1;
  undefined8 *local_50;
  char *p__;
  lyxp_var *item;
  char *var_value;
  char *var_name;
  char *pcStack_28;
  LY_ERR ret;
  char *value_local;
  char *name_local;
  lyxp_var **vars_local;
  
  var_name._4_4_ = 0;
  var_value = (char *)0x0;
  item = (lyxp_var *)0x0;
  if (((vars == (lyxp_var **)0x0) || (name == (char *)0x0)) || (value == (char *)0x0)) {
    return LY_EINVAL;
  }
  pcStack_28 = value;
  value_local = name;
  name_local = (char *)vars;
  if ((*vars == (lyxp_var *)0x0) ||
     (LVar1 = lyxp_vars_find((ly_ctx *)0x0,*vars,name,0,(lyxp_var **)&p__), LVar1 != LY_SUCCESS)) {
    var_value = strdup(value_local);
    item = (lyxp_var *)strdup(pcStack_28);
    if ((var_value != (char *)0x0) && (item != (lyxp_var *)0x0)) {
      if (*(long *)name_local == 0) {
        local_50 = (undefined8 *)malloc(0x18);
        if (local_50 != (undefined8 *)0x0) {
          *local_50 = 1;
          goto LAB_00137f11;
        }
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_vars_set");
      }
      else {
        *(long *)(*(long *)name_local + -8) = *(long *)(*(long *)name_local + -8) + 1;
        local_50 = (undefined8 *)
                   realloc((void *)(*(long *)name_local + -8),
                           *(long *)(*(long *)name_local + -8) * 0x10 + 8);
        if (local_50 != (undefined8 *)0x0) {
LAB_00137f11:
          *(undefined8 **)name_local = local_50 + 1;
          p__ = (char *)(*(long *)name_local + (*(long *)(*(long *)name_local + -8) + -1) * 0x10);
          memset(p__,0,0x10);
          *(char **)p__ = var_value;
          *(lyxp_var **)(p__ + 8) = item;
          goto LAB_00137f70;
        }
        *(long *)(*(long *)name_local + -8) = *(long *)(*(long *)name_local + -8) + -1;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxp_vars_set");
      }
    }
    var_name._4_4_ = LY_EMEM;
    free(var_value);
    free(item);
    vars_local._4_4_ = var_name._4_4_;
  }
  else {
    item = (lyxp_var *)strdup(pcStack_28);
    if (item == (lyxp_var *)0x0) {
      return LY_EMEM;
    }
    free(*(void **)(p__ + 8));
    *(lyxp_var **)(p__ + 8) = item;
LAB_00137f70:
    vars_local._4_4_ = LY_SUCCESS;
  }
  return vars_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyxp_vars_set(struct lyxp_var **vars, const char *name, const char *value)
{
    LY_ERR ret = LY_SUCCESS;
    char *var_name = NULL, *var_value = NULL;
    struct lyxp_var *item;

    if (!vars || !name || !value) {
        return LY_EINVAL;
    }

    /* if variable is already defined then change its value */
    if (*vars && !lyxp_vars_find(NULL, *vars, name, 0, &item)) {
        var_value = strdup(value);
        LY_CHECK_RET(!var_value, LY_EMEM);

        /* update value */
        free(item->value);
        item->value = var_value;
    } else {
        var_name = strdup(name);
        var_value = strdup(value);
        LY_CHECK_ERR_GOTO(!var_name || !var_value, ret = LY_EMEM, error);

        /* add new variable */
        LY_ARRAY_NEW_GOTO(NULL, *vars, item, ret, error);
        item->name = var_name;
        item->value = var_value;
    }

    return LY_SUCCESS;

error:
    free(var_name);
    free(var_value);
    return ret;
}